

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Block * __thiscall
soul::StructuralParser::parseBracedBlock
          (StructuralParser *this,pool_ptr<soul::AST::Function> *ownerFunction)

{
  bool bVar1;
  Block *pBVar2;
  Statement *s;
  undefined1 local_60 [8];
  ScopedScope scope;
  Context local_40;
  Block *local_28;
  Block *newBlock;
  pool_ptr<soul::AST::Function> *local_18;
  pool_ptr<soul::AST::Function> *ownerFunction_local;
  StructuralParser *this_local;
  
  newBlock = (Block *)anon_var_dwarf_10eeb4;
  local_18 = ownerFunction;
  ownerFunction_local = (pool_ptr<soul::AST::Function> *)this;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"{");
  getContext(&local_40,this);
  pBVar2 = allocate<soul::AST::Block,soul::AST::Context,soul::pool_ptr<soul::AST::Function>&>
                     (this,&local_40,ownerFunction);
  AST::Context::~Context(&local_40);
  local_28 = pBVar2;
  ScopedScope::ScopedScope((ScopedScope *)local_60,this,&pBVar2->super_Scope);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54ceac);
    pBVar2 = local_28;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    s = parseStatement(this);
    AST::Block::addStatement(pBVar2,s);
  }
  ScopedScope::~ScopedScope((ScopedScope *)local_60);
  return pBVar2;
}

Assistant:

AST::Block& parseBracedBlock (pool_ptr<AST::Function> ownerFunction)
    {
        expect (Operator::openBrace);
        auto& newBlock = allocate<AST::Block> (getContext(), ownerFunction);
        ScopedScope scope (*this, newBlock);

        while (! matchIf (Operator::closeBrace))
            newBlock.addStatement (parseStatement());

        return newBlock;
    }